

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta,longdouble obj_amp)

{
  solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
  *reduced_cost;
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar1;
  row_value rVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  bool bVar7;
  uint r_size;
  int selected;
  int iVar8;
  row_iterator prVar9;
  __uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
  _Var10;
  longdouble *plVar11;
  rc_data *ret_1;
  rc_data *prVar12;
  rc_data *prVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  rc_data *ret;
  long lVar19;
  longdouble in_ST0;
  longdouble lVar20;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar21;
  string_view fmt;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  undefined1 local_a8 [20];
  longdouble local_94;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_88;
  solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
  *local_80;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_78;
  undefined8 local_70;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_94 = obj_amp;
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  lVar21 = in_ST4;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if ((first->current)._M_current == (last->current)._M_current) {
    local_70._0_4_ = 0;
    local_70._4_4_ = 0;
  }
  else {
    local_80 = this + 0x10;
    reduced_cost = this + 0x60;
    local_70._0_4_ = 0;
    local_70._4_4_ = 0;
    local_88._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )first;
    local_78._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
            )last;
    do {
      k = (*(int **)local_88._M_t.
                    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                    _M_head_impl)[-1];
      sparse_matrix<int>::row((sparse_matrix<int> *)local_a8,(int)local_80);
      if (local_a8._8_8_ != local_a8._0_8_) {
        lVar19 = *(long *)(this + 0x50);
        prVar9 = (row_iterator)local_a8._8_8_;
        do {
          lVar16 = (long)prVar9->value * 0x10;
          *(longdouble *)(lVar19 + lVar16) = *(longdouble *)(lVar19 + lVar16) * local_68;
          prVar9 = prVar9 + 1;
        } while (prVar9 != (row_iterator)local_a8._0_8_);
      }
      r_size = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                           *)this,(row_iterator)local_a8._8_8_,(row_iterator)local_a8._0_8_,x);
      if (r_size != 0) {
        lVar19 = 0;
        lVar20 = in_ST0;
        lVar3 = in_ST1;
        lVar4 = in_ST2;
        lVar5 = in_ST3;
        lVar6 = in_ST4;
        in_ST4 = lVar21;
        do {
          in_ST3 = lVar6;
          in_ST2 = lVar5;
          in_ST1 = lVar4;
          in_ST0 = lVar3;
          quadratic_cost_type<long_double>::operator()
                    (*(longdouble **)(this + 0x178),
                     (quadratic_cost_type<long_double> *)
                     (ulong)(uint)((row_iterator)
                                  (local_a8._8_8_ +
                                  (long)*(int *)(*(long *)(this + 0x60) + 0x10 + lVar19) * 8))->
                                  column,(int)x,(bit_array *)local_a8._8_8_);
          *(longdouble *)(*(long *)(this + 0x60) + lVar19) =
               *(longdouble *)(*(long *)(this + 0x60) + lVar19) + local_94 * lVar20;
          lVar19 = lVar19 + 0x20;
          lVar20 = in_ST0;
          lVar3 = in_ST1;
          lVar4 = in_ST2;
          lVar5 = in_ST3;
          lVar6 = in_ST4;
          lVar21 = in_ST4;
        } while ((ulong)r_size << 5 != lVar19);
      }
      lVar19 = (long)k;
      switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar19)) {
      case 0:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar13 = *(rc_data **)(this + 0x60);
          lVar16 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar16,(int)LZCOUNT(lVar16) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar16);
          prVar12 = prVar13 + 1;
          lVar16 = lVar16 * 0x20 + -0x20;
          do {
            if ((prVar13->value != prVar12->value) || (NAN(prVar13->value) || NAN(prVar12->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar13,prVar12,plVar1);
              prVar13 = prVar12;
            }
            prVar12 = prVar12 + 1;
            lVar16 = lVar16 + -0x20;
          } while (lVar16 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar13,prVar12,plVar1);
        }
        iVar8 = *(int *)(*(long *)(this + 0x70) + lVar19 * 0xc);
        iVar15 = *(int *)(*(long *)(this + 0x70) + 4 + lVar19 * 0xc);
LAB_005dd8cf:
        selected = branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[]>>>
                             ((branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double> *)
                              (this + 0x80),
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                               *)reduced_cost,r_size,iVar8,iVar15);
        break;
      case 1:
switchD_005dd507_caseD_1:
        selected = exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[]>>>
                             ((exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *)
                              (this + 0x100),k,
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                               *)reduced_cost,r_size);
        break;
      case 2:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar13 = *(rc_data **)(this + 0x60);
          lVar16 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar16,(int)LZCOUNT(lVar16) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar16);
          prVar12 = prVar13 + 1;
          lVar16 = lVar16 * 0x20 + -0x20;
          do {
            if ((prVar13->value != prVar12->value) || (NAN(prVar13->value) || NAN(prVar12->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar13,prVar12,plVar1);
              prVar13 = prVar12;
            }
            prVar12 = prVar12 + 1;
            lVar16 = lVar16 + -0x20;
          } while (lVar16 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar13,prVar12,plVar1);
        }
        iVar8 = *(int *)(*(long *)(this + 0x70) + lVar19 * 0xc);
        iVar15 = *(int *)(*(long *)(this + 0x70) + 4 + lVar19 * 0xc);
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          _Var10._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
          ._M_head_impl =
               *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                 *)reduced_cost;
          iVar14 = 0;
          selected = -2;
          uVar18 = 0xffffffffffffffff;
          do {
            iVar17 = (int)uVar18;
            if (iVar15 < iVar14) {
              iVar17 = selected;
            }
            if (iVar14 < iVar8) {
              iVar17 = selected;
            }
            selected = iVar17;
            if ((selected != -2) &&
               ((longdouble)0 <
                *(longdouble *)
                 _Var10._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
                 ._M_head_impl)) break;
            uVar18 = uVar18 + 1;
            iVar14 = iVar14 + *(int *)((long)_Var10._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
                                             ._M_head_impl + 0x14);
            _Var10._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
            ._M_head_impl =
                 (tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                  )((long)_Var10._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
                          ._M_head_impl + 0x20);
          } while (r_size != uVar18);
        }
        if (selected == -2) goto LAB_005dd8cf;
        break;
      case 3:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar13 = *(rc_data **)(this + 0x60);
          lVar16 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar16,(int)LZCOUNT(lVar16) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar16);
          prVar12 = prVar13 + 1;
          lVar16 = lVar16 * 0x20 + -0x20;
          do {
            if ((prVar13->value != prVar12->value) || (NAN(prVar13->value) || NAN(prVar12->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar13,prVar12,plVar1);
              prVar13 = prVar12;
            }
            prVar12 = prVar12 + 1;
            lVar16 = lVar16 + -0x20;
          } while (lVar16 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar13,prVar12,plVar1);
        }
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          _Var10._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
          ._M_head_impl =
               *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                 *)reduced_cost;
          iVar15 = 0;
          uVar18 = 0xffffffffffffffff;
          iVar8 = -2;
          do {
            selected = (int)uVar18;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar19 * 0xc) < iVar15) {
              selected = iVar8;
            }
            if (iVar15 < *(int *)(*(long *)(this + 0x70) + lVar19 * 0xc)) {
              selected = iVar8;
            }
            if ((selected != -2) &&
               ((longdouble)0 <
                *(longdouble *)
                 _Var10._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
                 ._M_head_impl)) break;
            uVar18 = uVar18 + 1;
            iVar15 = iVar15 + *(int *)((long)_Var10._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
                                             ._M_head_impl + 0x14);
            _Var10._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
            ._M_head_impl =
                 (tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                  )((long)_Var10._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
                          ._M_head_impl + 0x20);
            iVar8 = selected;
          } while (r_size != uVar18);
        }
        if (selected == -2) goto switchD_005dd507_caseD_1;
        break;
      default:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar13 = *(rc_data **)(this + 0x60);
          lVar16 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar16,(int)LZCOUNT(lVar16) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar13,prVar13 + lVar16);
          prVar12 = prVar13 + 1;
          lVar16 = lVar16 * 0x20 + -0x20;
          do {
            if ((prVar13->value != prVar12->value) || (NAN(prVar13->value) || NAN(prVar12->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar13,prVar12,plVar1);
              prVar13 = prVar12;
            }
            prVar12 = prVar12 + 1;
            lVar16 = lVar16 + -0x20;
          } while (lVar16 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar13,prVar12,plVar1);
        }
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          plVar11 = *(longdouble **)(this + 0x60);
          iVar15 = 0;
          uVar18 = 0xffffffffffffffff;
          iVar8 = -2;
          do {
            selected = (int)uVar18;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar19 * 0xc) < iVar15) {
              selected = iVar8;
            }
            if (iVar15 < *(int *)(*(long *)(this + 0x70) + lVar19 * 0xc)) {
              selected = iVar8;
            }
            if ((selected != -2) && ((longdouble)0 < *plVar11)) break;
            uVar18 = uVar18 + 1;
            iVar15 = iVar15 + *(int *)((long)plVar11 + 0x14);
            plVar11 = plVar11 + 2;
            iVar8 = selected;
          } while (r_size != uVar18);
        }
      }
      bVar7 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                        (this,x,(row_value *)local_a8._8_8_,k,selected,r_size,local_48,local_58);
      local_70._0_1_ = (byte)local_70 | bVar7;
      rVar2 = *(row_value *)
               local_88._M_t.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
               .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl
      ;
      *(long *)local_88._M_t.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
               .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl
           = (long)rVar2 + -4;
    } while ((row_value)((long)rVar2 + -4) !=
             *(row_value *)
              local_78._M_t.
              super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
              .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl)
    ;
  }
  return (bool)((byte)local_70 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            Float pi_change;
            int selected;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
            default:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }